

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O1

int UpnpAcceptSubscription
              (UpnpDevice_Handle Hnd,char *DevID_const,char *ServName_const,char **VarName_const,
              char **NewVal_const,int cVariables,char *SubsId)

{
  Upnp_Handle_Type UVar1;
  uint uVar2;
  int iVar3;
  Handle_Info **HndInfo;
  Handle_Info *SInfo;
  Handle_Info *local_38;
  
  local_38 = (Handle_Info *)0x0;
  iVar3 = 6;
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xa9b,"Inside UpnpAcceptSubscription\n");
  if (UpnpSdkInit == 1) {
    HandleReadLock((char *)0xaa4,iVar3);
    HndInfo = &local_38;
    UVar1 = GetHandleInfo(Hnd,HndInfo);
    iVar3 = (int)HndInfo;
    if (UVar1 == HND_DEVICE) {
      if (DevID_const == (char *)0x0) {
        HandleUnlock((char *)0xab0,iVar3);
        uVar2 = 0xffffff9b;
        iVar3 = 0xab1;
      }
      else if (ServName_const == (char *)0x0) {
        HandleUnlock((char *)0xab6,iVar3);
        uVar2 = 0xffffff9b;
        iVar3 = 0xab7;
      }
      else if (SubsId == (char *)0x0) {
        HandleUnlock((char *)0xabc,iVar3);
        uVar2 = 0xffffff9b;
        iVar3 = 0xabd;
      }
      else {
        HandleUnlock((char *)0xacc,iVar3);
        uVar2 = genaInitNotify(Hnd,DevID_const,ServName_const,VarName_const,NewVal_const,cVariables,
                               SubsId);
        iVar3 = 0xace;
      }
    }
    else {
      HandleUnlock((char *)0xaaa,iVar3);
      uVar2 = 0xffffff9c;
      iVar3 = 0xaab;
    }
  }
  else {
    uVar2 = 0xffffff8c;
    iVar3 = 0xa9f;
  }
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",iVar3,
             "Exiting UpnpAcceptSubscription, ret = %d\n",(ulong)uVar2);
  return uVar2;
}

Assistant:

int UpnpAcceptSubscription(UpnpDevice_Handle Hnd,
	const char *DevID_const,
	const char *ServName_const,
	const char **VarName_const,
	const char **NewVal_const,
	int cVariables,
	const Upnp_SID SubsId)
{
	int ret = 0;
	int line = 0;
	struct Handle_Info *SInfo = NULL;
	char *DevID = (char *)DevID_const;
	char *ServName = (char *)ServName_const;
	char **VarName = (char **)VarName_const;
	char **NewVal = (char **)NewVal_const;

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpAcceptSubscription\n");

	if (UpnpSdkInit != 1) {
		line = __LINE__;
		ret = UPNP_E_FINISH;
		goto exit_function;
	}

	HandleReadLock(__FILE__, __LINE__);

	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_DEVICE:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		line = __LINE__;
		ret = UPNP_E_INVALID_HANDLE;
		goto exit_function;
	}
	if (DevID == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		line = __LINE__;
		ret = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
	if (ServName == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		line = __LINE__;
		ret = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
	if (SubsId == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		line = __LINE__;
		ret = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
		/* Now accepts an empty state list, so the code below is
		 * commented out */
		#if 0
	if (VarName == NULL || NewVal == NULL || cVariables < 0) {
		HandleUnlock(__FILE__, __LINE__);
		line = __LINE__;
		ret = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
		#endif

	HandleUnlock(__FILE__, __LINE__);

	line = __LINE__;
	ret = genaInitNotify(
		Hnd, DevID, ServName, VarName, NewVal, cVariables, SubsId);

exit_function:
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		line,
		"Exiting UpnpAcceptSubscription, ret = %d\n",
		ret);

	return ret;
}